

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O1

u32 __thiscall moira::Moira::readExt<(moira::Core)2,4>(Moira *this)

{
  PrefetchQueue PVar1;
  u32 uVar2;
  u32 uVar3;
  
  PVar1 = this->queue;
  uVar2 = (this->reg).pc + 2;
  (this->reg).pc = uVar2;
  uVar2 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar2);
  (this->queue).irc = (u16)uVar2;
  uVar3 = (this->reg).pc + 2;
  (this->reg).pc = uVar3;
  uVar3 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar3);
  (this->queue).irc = (u16)uVar3;
  return uVar2 & 0xffff | (int)PVar1 << 0x10;
}

Assistant:

u32
Moira::readExt()
{
    u32 result = queue.irc;
    readExt<C>();

    if constexpr (S == Long) {

        result = result << 16 | queue.irc;
        readExt<C>();
    }

    return result;
}